

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void __thiscall
CharConvUTF8::unpack(CharConvUTF8 *this,vm_val_t *val,CVmDataSource *src,int cnt,char pad)

{
  vm_obj_id_t obj;
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  int in_ECX;
  size_t *in_RDX;
  vm_val_t *in_RSI;
  char in_R8B;
  size_t rem;
  utf8_ptr p;
  CVmObjString *str;
  char *in_stack_ffffffffffffffa8;
  utf8_ptr *in_stack_ffffffffffffffb0;
  size_t *rem_00;
  utf8_ptr local_30;
  CVmObject *local_28;
  char local_1d;
  int local_1c;
  size_t *local_18;
  vm_val_t *local_10;
  
  local_1d = in_R8B;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  obj = CVmObjString::create
                  ((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(size_t)in_stack_ffffffffffffffa8
                  );
  vm_val_t::set_obj(in_RSI,obj);
  local_28 = vm_objp(0);
  CVmStack::push(local_10);
  if (local_1c != 0) {
    pcVar3 = CVmObjString::cons_get_buf((CVmObjString *)local_28);
    iVar1 = (**(code **)(*local_18 + 0x10))(local_18,pcVar3,(long)local_1c);
    if (iVar1 != 0) {
      err_throw(0);
    }
    pcVar3 = CVmObjString::cons_get_buf((CVmObjString *)local_28);
    CCharmapToUni::validate(pcVar3,(long)local_1c);
    CVmObjString::cons_get_buf((CVmObjString *)local_28);
    utf8_ptr::utf8_ptr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    rem_00 = local_18;
    do {
      if (local_1c < 1) goto LAB_0037f7fc;
      utf8_ptr::dec((utf8_ptr *)in_RSI,rem_00);
      wVar2 = utf8_ptr::getch((utf8_ptr *)0x37f7e0);
    } while (wVar2 == local_1d);
    utf8_ptr::inc((utf8_ptr *)in_RSI,rem_00);
LAB_0037f7fc:
    utf8_ptr::getptr(&local_30);
    CVmObjString::cons_shrink_buffer((CVmObjString *)in_RSI,(char *)rem_00);
  }
  CVmStack::discard();
  return;
}

Assistant:

virtual void unpack(VMG_ vm_val_t *val, CVmDataSource *src, int cnt,
                        char pad)
    {
        /*
         *   For UTF-8, we can simply read the bytes directly into a string
         *   buffer.  Allocate the string at the required byte size, and push
         *   for gc protection.  
         */
        val->set_obj(CVmObjString::create(vmg_ FALSE, cnt));
        CVmObjString *str = (CVmObjString *)vm_objp(vmg_ val->val.obj);
        G_stk->push(val);

        /* if the read count is non-zero, read the data */
        if (cnt != 0)
        {
            /* read the data directly into the string buffer */
            if (src->read(str->cons_get_buf(), cnt))
                err_throw(VMERR_READ_FILE);

            /* validate the UTF-8 */
            CCharmapToUni::validate(str->cons_get_buf(), cnt);

            /* remove trailing padding */
            utf8_ptr p(str->cons_get_buf() + cnt);
            for (size_t rem = 0 ; (int)rem < cnt ; )
            {
                /* 
                 *   move to the previous character; if it's not the padding
                 *   character, we're done 
                 */
                p.dec(&rem);
                if (p.getch() != pad)
                {
                    p.inc(&rem);
                    break;
                }
            }

            /* set the string length to the length without the padding */
            str->cons_shrink_buffer(vmg_ p.getptr());
        }

        /* done with the gc protection */
        G_stk->discard();
    }